

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void disruptor::test::SleepingStrategy::SignalTimeoutWaitingOnCursor_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *pbVar2;
  SignalTimeoutWaitingOnCursor t;
  char (*in_stack_fffffffffffff438) [29];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff440;
  std_string *in_stack_fffffffffffff448;
  basic_cstring<const_char> *in_stack_fffffffffffff450;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff460;
  SignalTimeoutWaitingOnCursor *in_stack_fffffffffffff5c0;
  undefined1 local_930 [16];
  basic_cstring<const_char> local_920;
  undefined1 local_909;
  basic_wrap_stringstream<char> local_908;
  undefined1 local_770 [16];
  basic_cstring<const_char> local_760;
  undefined1 local_749;
  basic_wrap_stringstream<char> local_748;
  undefined1 local_5b0 [16];
  basic_cstring<const_char> local_5a0;
  undefined1 local_589;
  basic_wrap_stringstream<char> local_588;
  undefined1 local_3f0 [16];
  basic_cstring<const_char> local_3e0 [34];
  undefined1 local_1b9;
  basic_wrap_stringstream<char> local_1b8;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1b9 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [15])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10,0x108,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  SignalTimeoutWaitingOnCursor::SignalTimeoutWaitingOnCursor
            ((SignalTimeoutWaitingOnCursor *)0x11d74f);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_3e0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_588,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_588);
  local_589 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [16])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_3e0,0x108,local_3f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::unit_test::
  setup_conditional<disruptor::test::SleepingStrategy::SignalTimeoutWaitingOnCursor>
            ((SignalTimeoutWaitingOnCursor *)in_stack_fffffffffffff440);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_748,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_748);
  local_749 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [13])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5a0,0x108,local_5b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  SignalTimeoutWaitingOnCursor::test_method(in_stack_fffffffffffff5c0);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_760,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_908);
  local_909 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [19])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_760,0x108,local_770);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::unit_test::
  teardown_conditional<disruptor::test::SleepingStrategy::SignalTimeoutWaitingOnCursor>
            ((SignalTimeoutWaitingOnCursor *)in_stack_fffffffffffff440);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_920,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  pbVar2 = (basic_wrap_stringstream<char> *)&stack0xfffffffffffff538;
  memset(pbVar2,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref
            ((basic_wrap_stringstream<char> *)&stack0xfffffffffffff538);
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  this = boost::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  s = boost::operator<<(in_stack_fffffffffffff440,(char (*) [15])in_stack_fffffffffffff438);
  pbVar2 = (basic_wrap_stringstream<char> *)
           boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_920,0x108,local_930);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(pbVar2);
  SignalTimeoutWaitingOnCursor::~SignalTimeoutWaitingOnCursor
            ((SignalTimeoutWaitingOnCursor *)0x11dbab);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}